

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint64 uVar6;
  uint8 *other;
  ulong uVar7;
  results *local_3f0;
  bool *local_3c0;
  results *local_3a8;
  results *local_390;
  uint8 *local_378;
  uint local_36c;
  uint b_1;
  uint i_2;
  uint8 *pSelectors;
  int subblock_1;
  uint b;
  int x;
  uint8 *pSelectors1;
  uint8 *pSelectors0;
  uint selector1;
  uint selector0;
  int db;
  int dg;
  int dr;
  uint refinement_error_thresh1;
  uint refinement_error_thresh0;
  uint32 subblock_pixel0_u32;
  color_quad_u8 *pSrc_col;
  ulong uStack_310;
  uint subblock;
  uint64 trial_error;
  uint use_color4;
  uint flip;
  params params;
  color_quad_u8 subblock_pixels [8];
  uint local_29c;
  undefined1 local_298 [4];
  uint i_1;
  results results [3];
  uint8 selectors [3] [8];
  undefined1 local_1f8 [4];
  uint i;
  results best_results [2];
  uint8 best_selectors [2] [8];
  uint local_190;
  uint local_18c;
  uint best_use_color4;
  uint best_flip;
  uint64 best_error;
  etc1_optimizer optimizer;
  color_quad_u8 dithered_pixels [16];
  int r;
  uint32 first_pixel_u32;
  color_quad_u8 src_pixel0;
  etc1_block *dst_block;
  color_quad_u8 *pSrc_pixels;
  etc1_pack_params *pack_params_local;
  uint *pSrc_pixels_rgba_local;
  void *pETC1_block_local;
  
  _first_pixel_u32 = (etc1_block *)pETC1_block;
  color_quad_u8::color_quad_u8((color_quad_u8 *)&r,(color_quad_u8 *)pSrc_pixels_rgba);
  for (dithered_pixels[0xf].field_0 =
            (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
            (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xf;
      (0 < (int)dithered_pixels[0xf].field_0 &&
      (pSrc_pixels_rgba[(int)dithered_pixels[0xf].field_0] == *pSrc_pixels_rgba));
      dithered_pixels[0xf].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)((int)dithered_pixels[0xf].field_0 - 1)) {
  }
  if (dithered_pixels[0xf].field_0 == 0) {
    uVar6 = pack_etc1_block_solid_color(_first_pixel_u32,(uint8 *)pSrc_pixels_rgba);
    pETC1_block_local._4_4_ = (uint)(uVar6 << 4);
  }
  else {
    local_378 = optimizer.m_temp_selectors;
    do {
      color_quad_u8::color_quad_u8((color_quad_u8 *)local_378);
      local_378 = local_378 + 4;
    } while ((color_quad_u8 *)local_378 != dithered_pixels + 0xe);
    dst_block = (etc1_block *)pSrc_pixels_rgba;
    if ((pack_params->m_dithering & 1U) != 0) {
      dither_block_555((color_quad_u8 *)optimizer.m_temp_selectors,(color_quad_u8 *)pSrc_pixels_rgba
                      );
      dst_block = (etc1_block *)optimizer.m_temp_selectors;
    }
    etc1_optimizer::etc1_optimizer((etc1_optimizer *)&best_error);
    _best_use_color4 = 0xffffffffffffffff;
    local_18c = 0;
    local_190 = 0;
    local_390 = (results *)local_1f8;
    do {
      etc1_optimizer::results::results(local_390);
      local_390 = local_390 + 1;
    } while (local_390 != (results *)&best_results[1].m_block_color4);
    selectors[2][4] = '\0';
    selectors[2][5] = '\0';
    selectors[2][6] = '\0';
    selectors[2][7] = '\0';
    for (; (uint)selectors[2]._4_4_ < 2; selectors[2]._4_4_ = selectors[2]._4_4_ + 1) {
      best_results[(uint)selectors[2]._4_4_].m_block_color_unscaled.field_0.m_u32 = 8;
      *(uint8 (**) [8])&best_results[(uint)selectors[2]._4_4_].m_n =
           best_selectors + ((ulong)(uint)selectors[2]._4_4_ - 1);
    }
    local_3a8 = (results *)local_298;
    do {
      etc1_optimizer::results::results(local_3a8);
      local_3a8 = local_3a8 + 1;
    } while (local_3a8 != (results *)&results[2].m_block_color4);
    for (local_29c = 0; local_29c < 3; local_29c = local_29c + 1) {
      results[local_29c].m_block_color_unscaled.field_0.m_u32 = 8;
      *(uint8 (**) [8])&results[local_29c].m_n = selectors + ((ulong)local_29c - 1);
    }
    local_3c0 = &params.m_constrain_against_base_color5;
    do {
      color_quad_u8::color_quad_u8((color_quad_u8 *)local_3c0);
      local_3c0 = local_3c0 + 4;
    } while ((color_quad_u8 *)local_3c0 != subblock_pixels + 6);
    etc1_optimizer::params::params((params *)&use_color4,pack_params);
    params.super_etc1_pack_params.m_quality = 8;
    params._8_8_ = &params.m_constrain_against_base_color5;
    for (trial_error._4_4_ = 0; trial_error._4_4_ < 2; trial_error._4_4_ = trial_error._4_4_ + 1) {
      for (trial_error._0_4_ = 0; (uint)trial_error < 2; trial_error._0_4_ = (uint)trial_error + 1)
      {
        uStack_310 = 0;
        for (pSrc_col._4_4_ = 0; pSrc_col._4_4_ < 2; pSrc_col._4_4_ = pSrc_col._4_4_ + 1) {
          if (trial_error._4_4_ == 0) {
            other = dst_block->m_low_color + (ulong)(pSrc_col._4_4_ << 1) * 4 + -8;
            color_quad_u8::operator=
                      ((color_quad_u8 *)&params.m_constrain_against_base_color5,
                       (color_quad_u8 *)other);
            color_quad_u8::operator=
                      ((color_quad_u8 *)&params.field_0x34,(color_quad_u8 *)(other + 0x10));
            color_quad_u8::operator=(subblock_pixels,(color_quad_u8 *)(other + 0x20));
            color_quad_u8::operator=(subblock_pixels + 1,(color_quad_u8 *)(other + 0x30));
            color_quad_u8::operator=(subblock_pixels + 2,(color_quad_u8 *)(other + 4));
            color_quad_u8::operator=(subblock_pixels + 3,(color_quad_u8 *)(other + 0x14));
            color_quad_u8::operator=(subblock_pixels + 4,(color_quad_u8 *)(other + 0x24));
            color_quad_u8::operator=(subblock_pixels + 5,(color_quad_u8 *)(other + 0x34));
          }
          else {
            uVar7 = (ulong)(pSrc_col._4_4_ << 3);
            params._48_8_ = *(undefined8 *)(dst_block->m_low_color + uVar7 * 4 + -8);
            subblock_pixels._0_8_ = *(undefined8 *)(dst_block->m_low_color + uVar7 * 4);
            subblock_pixels._8_8_ = *(undefined8 *)(dst_block[1].m_low_color + uVar7 * 4 + -8);
            subblock_pixels._16_8_ = *(undefined8 *)(dst_block[1].m_low_color + uVar7 * 4);
          }
          results[1].m_block_color4 = true;
          results[1]._33_7_ = 0xffffffffffffff;
          if ((0 < (int)use_color4) && ((pSrc_col._4_4_ != 0 || ((uint)trial_error != 0)))) {
            dithered_pixels[0xf].field_0 =
                 (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0x7;
            while ((0 < (int)dithered_pixels[0xf].field_0 &&
                   (subblock_pixels[(long)(int)dithered_pixels[0xf].field_0 + -2].field_0.m_u32 ==
                    params._48_4_))) {
              dithered_pixels[0xf].field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                   (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                   (dithered_pixels[0xf].field_0 - 1).field_0;
            }
            if (dithered_pixels[0xf].field_0 == 0) {
              if ((pSrc_col._4_4_ == 0) || ((uint)trial_error != 0)) {
                local_3f0 = (results *)0x0;
              }
              else {
                local_3f0 = results;
              }
              pack_etc1_block_solid_color_constrained
                        ((results *)&results[1].m_block_color4,8,
                         &params.m_constrain_against_base_color5,
                         (bool)(((uint)trial_error != 0 ^ 0xffU) & 1),(color_quad_u8 *)local_3f0);
            }
          }
          params.m_pSrc_pixels._0_1_ = (uint)trial_error != 0;
          params.m_scan_delta_size._0_1_ = 0;
          if (((uint)trial_error == 0) && (pSrc_col._4_4_ != 0)) {
            params.m_scan_delta_size._0_1_ = 1;
            color_quad_u8::operator=
                      ((color_quad_u8 *)((long)&params.m_pScan_deltas + 4),(color_quad_u8 *)results)
            ;
          }
          if (use_color4 == 2) {
            params.m_pScan_deltas._0_4_ = 9;
            params._24_8_ = pack_etc1_block::s_scan_delta_0_to_4;
          }
          else if (use_color4 == 1) {
            params.m_pScan_deltas._0_4_ = 3;
            params._24_8_ = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            params.m_pScan_deltas._0_4_ = 1;
            params._24_8_ = pack_etc1_block::s_scan_delta_0;
          }
          etc1_optimizer::init((etc1_optimizer *)&best_error,(EVP_PKEY_CTX *)&use_color4);
          bVar5 = etc1_optimizer::compute((etc1_optimizer *)&best_error);
          if (!bVar5) break;
          if (0 < (int)use_color4) {
            if (3000 < *(ulong *)(local_298 + (ulong)pSrc_col._4_4_ * 0x28)) {
              if (use_color4 == 1) {
                params.m_pScan_deltas._0_4_ = 4;
                params._24_8_ = pack_etc1_block::s_scan_delta_2_to_3;
              }
              else if (*(ulong *)(local_298 + (ulong)pSrc_col._4_4_ * 0x28) < 0x1771) {
                params.m_pScan_deltas._0_4_ = 2;
                params._24_8_ = pack_etc1_block::s_scan_delta_5_to_5;
              }
              else {
                params.m_pScan_deltas._0_4_ = 8;
                params._24_8_ = pack_etc1_block::s_scan_delta_5_to_8;
              }
              bVar5 = etc1_optimizer::compute((etc1_optimizer *)&best_error);
              if (!bVar5) break;
            }
            if ((ulong)results[1]._32_8_ < *(ulong *)(local_298 + (ulong)pSrc_col._4_4_ * 0x28)) {
              etc1_optimizer::results::operator=
                        ((results *)(local_298 + (ulong)pSrc_col._4_4_ * 0x28),
                         (results *)&results[1].m_block_color4);
            }
          }
          uStack_310 = *(long *)(local_298 + (ulong)pSrc_col._4_4_ * 0x28) + uStack_310;
          if (_best_use_color4 <= uStack_310) break;
        }
        if (1 < pSrc_col._4_4_) {
          _best_use_color4 = uStack_310;
          etc1_optimizer::results::operator=((results *)local_1f8,(results *)local_298);
          etc1_optimizer::results::operator=
                    ((results *)&best_results[0].m_block_color4,
                     (results *)&results[0].m_block_color4);
          local_18c = trial_error._4_4_;
          local_190 = (uint)trial_error;
        }
      }
    }
    db = (uint)(byte)best_results[1].m_error - (uint)(byte)best_results[0].m_error;
    selector0 = (uint)best_results[1].m_error._1_1_ - (uint)best_results[0].m_error._1_1_;
    selector1 = (uint)best_results[1].m_error._2_1_ - (uint)best_results[0].m_error._2_1_;
    if (local_190 == 0) {
      if (db < 0) {
        db = db + 8;
      }
      (_first_pixel_u32->field_0).m_bytes[0] = (byte)best_results[0].m_error << 3 | (byte)db;
      if ((int)selector0 < 0) {
        selector0 = selector0 + 8;
      }
      (_first_pixel_u32->field_0).m_bytes[1] = best_results[0].m_error._1_1_ << 3 | (byte)selector0;
      if ((int)selector1 < 0) {
        selector1 = selector1 + 8;
      }
      (_first_pixel_u32->field_0).m_bytes[2] = best_results[0].m_error._2_1_ << 3 | (byte)selector1;
    }
    else {
      (_first_pixel_u32->field_0).m_bytes[0] =
           (byte)best_results[1].m_error | (byte)best_results[0].m_error << 4;
      (_first_pixel_u32->field_0).m_bytes[1] =
           best_results[1].m_error._1_1_ | best_results[0].m_error._1_1_ << 4;
      (_first_pixel_u32->field_0).m_bytes[2] =
           best_results[1].m_error._2_1_ | best_results[0].m_error._2_1_ << 4;
    }
    (_first_pixel_u32->field_0).m_bytes[3] =
         (byte)(best_results[1].m_error._4_4_ << 2) | (byte)(best_results[0].m_error._4_4_ << 5) |
         (byte)(((local_190 ^ 0xffffffff) & 1) << 1) | (byte)local_18c;
    pSelectors0._4_4_ = 0;
    pSelectors0._0_4_ = 0;
    if (local_18c == 0) {
      pSelectors._4_4_ = 1;
      while( true ) {
        if (pSelectors._4_4_ < 0) break;
        _b_1 = (byte *)(*(long *)&best_results[pSelectors._4_4_].m_n + 4);
        for (local_36c = 0; local_36c < 2; local_36c = local_36c + 1) {
          pSelectors0._4_4_ =
               (((pSelectors0._4_4_ << 1 |
                 *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[3]) & 1) << 1 |
                *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[2]) & 1) << 1 |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[1]) & 1) << 1 |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)*_b_1) & 1;
          pSelectors0._0_4_ =
               ((((uint)pSelectors0 << 1 |
                 (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[3]) >> 1)) << 1 |
                (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[2]) >> 1)) << 1 |
               (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[1]) >> 1)) << 1 |
               (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*_b_1) >> 1);
          _b_1 = _b_1 + -4;
        }
        pSelectors._4_4_ = pSelectors._4_4_ + -1;
      }
    }
    else {
      subblock_1 = 3;
      while( true ) {
        if (subblock_1 < 0) break;
        bVar1 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[1]._16_8_ + (long)(subblock_1 + 4)));
        bVar2 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[1]._16_8_ + (long)subblock_1));
        bVar3 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[0]._16_8_ + (long)(subblock_1 + 4)));
        bVar4 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[0]._16_8_ + (long)subblock_1));
        pSelectors0._4_4_ =
             (((pSelectors0._4_4_ << 1 | bVar1 & 1) << 1 | bVar2 & 1) << 1 | bVar3 & 1) << 1 |
             bVar4 & 1;
        pSelectors0._0_4_ =
             ((((uint)pSelectors0 << 1 | (uint)(bVar1 >> 1)) << 1 | (uint)(bVar2 >> 1)) << 1 |
             (uint)(bVar3 >> 1)) << 1 | (uint)(bVar4 >> 1);
        subblock_1 = subblock_1 + -1;
      }
    }
    (_first_pixel_u32->field_0).m_bytes[4] = (uint8)((ushort)pSelectors0._0_2_ >> 8);
    (_first_pixel_u32->field_0).m_bytes[5] = (uint8)pSelectors0._0_2_;
    (_first_pixel_u32->field_0).m_bytes[6] = (uint8)((ushort)pSelectors0._4_2_ >> 8);
    (_first_pixel_u32->field_0).m_bytes[7] = (uint8)pSelectors0._4_2_;
    pETC1_block_local._4_4_ = (uint)_best_use_color4;
  }
  return pETC1_block_local._4_4_;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params) {
  const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
  etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

  color_quad_u8 src_pixel0(pSrc_pixels[0]);

  // Check for solid block.
  const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
  int r;
  for (r = 15; r >= 1; --r)
    if (pSrc_pixels[r].m_u32 != first_pixel_u32)
      break;
  if (!r)
    return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));

  color_quad_u8 dithered_pixels[16];
  if (pack_params.m_dithering) {
    dither_block_555(dithered_pixels, pSrc_pixels);
    pSrc_pixels = dithered_pixels;
  }

  etc1_optimizer optimizer;

  uint64 best_error = cUINT64_MAX;
  uint best_flip = false, best_use_color4 = false;

  uint8 best_selectors[2][8];
  etc1_optimizer::results best_results[2];
  for (uint i = 0; i < 2; i++) {
    best_results[i].m_n = 8;
    best_results[i].m_pSelectors = best_selectors[i];
  }

  uint8 selectors[3][8];
  etc1_optimizer::results results[3];

  for (uint i = 0; i < 3; i++) {
    results[i].m_n = 8;
    results[i].m_pSelectors = selectors[i];
  }

  color_quad_u8 subblock_pixels[8];

  etc1_optimizer::params params(pack_params);
  params.m_num_src_pixels = 8;
  params.m_pSrc_pixels = subblock_pixels;

  for (uint flip = 0; flip < 2; flip++) {
    for (uint use_color4 = 0; use_color4 < 2; use_color4++) {
      uint64 trial_error = 0;

      uint subblock;
      for (subblock = 0; subblock < 2; subblock++) {
        if (flip)
          memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
        else {
          const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
          subblock_pixels[0] = pSrc_col[0];
          subblock_pixels[1] = pSrc_col[4];
          subblock_pixels[2] = pSrc_col[8];
          subblock_pixels[3] = pSrc_col[12];
          subblock_pixels[4] = pSrc_col[1];
          subblock_pixels[5] = pSrc_col[5];
          subblock_pixels[6] = pSrc_col[9];
          subblock_pixels[7] = pSrc_col[13];
        }

        results[2].m_error = cUINT64_MAX;
        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4))) {
          const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
          for (r = 7; r >= 1; --r)
            if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
              break;
          if (!r) {
            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : NULL);
          }
        }

        params.m_use_color4 = (use_color4 != 0);
        params.m_constrain_against_base_color5 = false;

        if ((!use_color4) && (subblock)) {
          params.m_constrain_against_base_color5 = true;
          params.m_base_color5 = results[0].m_block_color_unscaled;
        }

        if (params.m_quality == cHighQuality) {
          static const int s_scan_delta_0_to_4[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
          params.m_pScan_deltas = s_scan_delta_0_to_4;
        } else if (params.m_quality == cMediumQuality) {
          static const int s_scan_delta_0_to_1[] = {-1, 0, 1};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
          params.m_pScan_deltas = s_scan_delta_0_to_1;
        } else {
          static const int s_scan_delta_0[] = {0};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
          params.m_pScan_deltas = s_scan_delta_0;
        }

        optimizer.init(params, results[subblock]);
        if (!optimizer.compute())
          break;

        if (params.m_quality >= cMediumQuality) {
          // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
          const uint refinement_error_thresh0 = 3000;
          const uint refinement_error_thresh1 = 6000;
          if (results[subblock].m_error > refinement_error_thresh0) {
            if (params.m_quality == cMediumQuality) {
              static const int s_scan_delta_2_to_3[] = {-3, -2, 2, 3};
              params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
              params.m_pScan_deltas = s_scan_delta_2_to_3;
            } else {
              static const int s_scan_delta_5_to_5[] = {-5, 5};
              static const int s_scan_delta_5_to_8[] = {-8, -7, -6, -5, 5, 6, 7, 8};
              if (results[subblock].m_error > refinement_error_thresh1) {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                params.m_pScan_deltas = s_scan_delta_5_to_8;
              } else {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                params.m_pScan_deltas = s_scan_delta_5_to_5;
              }
            }

            if (!optimizer.compute())
              break;
          }

          if (results[2].m_error < results[subblock].m_error)
            results[subblock] = results[2];
        }

        trial_error += results[subblock].m_error;
        if (trial_error >= best_error)
          break;
      }

      if (subblock < 2)
        continue;

      best_error = trial_error;
      best_results[0] = results[0];
      best_results[1] = results[1];
      best_flip = flip;
      best_use_color4 = use_color4;

    }  // use_color4

  }  // flip

  int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
  int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
  int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
  RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

  if (best_use_color4) {
    dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
    dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
    dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
  } else {
    if (dr < 0)
      dr += 8;
    dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
    if (dg < 0)
      dg += 8;
    dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
    if (db < 0)
      db += 8;
    dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
  }

  dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

  uint selector0 = 0, selector1 = 0;
  if (best_flip) {
    // flipped:
    // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
    // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
    //
    // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
    // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
    const uint8* pSelectors0 = best_results[0].m_pSelectors;
    const uint8* pSelectors1 = best_results[1].m_pSelectors;
    for (int x = 3; x >= 0; --x) {
      uint b;
      b = g_selector_index_to_etc1[pSelectors1[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors1[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);
    }
  } else {
    // non-flipped:
    // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
    // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
    //
    // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
    // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
    for (int subblock = 1; subblock >= 0; --subblock) {
      const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
      for (uint i = 0; i < 2; i++) {
        uint b;
        b = g_selector_index_to_etc1[pSelectors[3]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[2]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[1]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[0]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        pSelectors -= 4;
      }
    }
  }

  dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
  dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
  dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
  dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

  return static_cast<unsigned int>(best_error);
}